

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicBuildMonolithic::Run(BasicBuildMonolithic *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  GLuint shader;
  GLuint shader_00;
  GLuint shader_01;
  GLuint program;
  undefined4 extraout_EAX;
  int iVar3;
  bool *compile_error;
  long lVar4;
  GLuint buffer;
  char *cs3;
  char *cs2;
  GLint type;
  vec4 data;
  char *cs1 [2];
  GLuint local_74;
  char *local_70;
  char *local_68;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_48;
  char *pcStack_40;
  
  local_48 = "#version 430 core";
  pcStack_40 = "\nlayout(local_size_x = 1) in;\nvoid Run();\nvoid main() {\n  Run();\n}";
  local_68 = 
  "#version 430 core\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput();\nvoid Run() {\n  g_output = CalculateOutput();\n}"
  ;
  local_70 = 
  "#version 430 core\nlayout(local_size_x = 1) in;\nlayout(binding = 0, std430) buffer Output {\n  vec4 g_output;\n};\nvec4 CalculateOutput() {\n  g_output = vec4(0);\n  return vec4(1, 2, 3, 4);\n}"
  ;
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b4f,&local_5c);
  if (local_5c == 0x91b9) {
    glu::CallLogWrapper::glShaderSource(this_00,shader,2,&local_48,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader);
    shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&local_68,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader_00);
    shader_01 = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glShaderSource(this_00,shader_01,1,&local_70,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader_01);
    program = glu::CallLogWrapper::glCreateProgram(this_00);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader_01);
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
    glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
    glu::CallLogWrapper::glDeleteShader(this_00,shader_01);
    bVar2 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,program,compile_error);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&local_74);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,local_74);
    local_58 = 0;
    uStack_50 = 0;
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_58,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    local_58 = 0;
    uStack_50 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_74);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,&local_58);
    auVar1._4_4_ = -(uint)(local_58._4_4_ != 2.0);
    auVar1._0_4_ = -(uint)((float)local_58 != 1.0);
    auVar1._8_4_ = -(uint)((float)uStack_50 != 3.0);
    auVar1._12_4_ = -(uint)(uStack_50._4_4_ != 4.0);
    iVar3 = movmskps(extraout_EAX,auVar1);
    if (iVar3 != 0) {
      bVar2 = false;
      anon_unknown_0::Output("Invalid value!\n");
    }
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&local_74);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    glu::CallLogWrapper::glDeleteProgram(this_00,program);
    lVar4 = (ulong)bVar2 - 1;
  }
  else {
    lVar4 = 0;
    anon_unknown_0::Output("SHADER_TYPE should be COMPUTE_SHADER.\n");
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		const char* const cs1[2] = { "#version 430 core",

									 NL "layout(local_size_x = 1) in;" NL "void Run();" NL "void main() {" NL
										"  Run();" NL "}" };

		const char* const cs2 =
			"#version 430 core" NL "layout(binding = 0, std430) buffer Output {" NL "  vec4 g_output;" NL "};" NL
			"vec4 CalculateOutput();" NL "void Run() {" NL "  g_output = CalculateOutput();" NL "}";

		const char* const cs3 =
			"#version 430 core" NL "layout(local_size_x = 1) in;" NL "layout(binding = 0, std430) buffer Output {" NL
			"  vec4 g_output;" NL "};" NL "vec4 CalculateOutput() {" NL "  g_output = vec4(0);" NL
			"  return vec4(1, 2, 3, 4);" NL "}";

		const GLuint sh1 = glCreateShader(GL_COMPUTE_SHADER);

		GLint type;
		glGetShaderiv(sh1, GL_SHADER_TYPE, &type);
		if (static_cast<GLenum>(type) != GL_COMPUTE_SHADER)
		{
			Output("SHADER_TYPE should be COMPUTE_SHADER.\n");
			glDeleteShader(sh1);
			return false;
		}

		glShaderSource(sh1, 2, cs1, NULL);
		glCompileShader(sh1);

		const GLuint sh2 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh2, 1, &cs2, NULL);
		glCompileShader(sh2);

		const GLuint sh3 = glCreateShader(GL_COMPUTE_SHADER);
		glShaderSource(sh3, 1, &cs3, NULL);
		glCompileShader(sh3);

		const GLuint p = glCreateProgram();
		glAttachShader(p, sh1);
		glAttachShader(p, sh2);
		glAttachShader(p, sh3);
		glLinkProgram(p);

		glDeleteShader(sh1);
		glDeleteShader(sh2);
		glDeleteShader(sh3);

		bool res = CheckProgram(p);

		GLuint buffer;
		glGenBuffers(1, &buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4), &vec4(0.0f)[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(p);
		glDispatchCompute(1, 1, 1);

		vec4 data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4), &data[0]);
		if (!IsEqual(data, vec4(1.0f, 2.0f, 3.0f, 4.0f)))
		{
			Output("Invalid value!\n");
			res = false;
		}

		glDeleteBuffers(1, &buffer);
		glUseProgram(0);
		glDeleteProgram(p);

		return res == true ? NO_ERROR : ERROR;
	}